

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlitDepthStencilCase::render(BlitDepthStencilCase *this,Surface *dst)

{
  deUint32 dVar1;
  int srcX1;
  int srcY1;
  int dstX0;
  int dstY0;
  int dstX1;
  int iVar2;
  int iVar3;
  DataTypes *samplerTypes;
  Context *pCVar4;
  int *piVar5;
  void *data_00;
  IVec2 *local_718;
  deUint32 local_70c;
  deUint32 *local_708;
  deUint32 *local_700;
  deUint32 *local_6f8;
  Vector<float,_4> local_690;
  Vector<float,_4> local_680;
  TextureFormat local_670;
  Vector<float,_3> local_668;
  Vector<float,_3> local_65c;
  Vector<float,_4> local_650;
  Vector<float,_3> local_640;
  Vector<float,_3> local_634;
  Vector<float,_4> local_628;
  Vector<float,_3> local_618;
  Vector<float,_3> local_60c;
  PixelBufferAccess local_600;
  Vector<float,_4> local_5d8;
  Vector<float,_4> local_5c8;
  PixelBufferAccess local_5b8;
  TextureFormat local_590;
  undefined1 local_588 [8];
  TextureLevel data;
  deUint32 gridTex;
  int texH;
  int texW;
  deUint32 dataType;
  deUint32 format;
  Vector<float,_3> local_53c;
  IVec2 *local_530;
  IVec2 *size;
  deUint32 *pdStack_520;
  deUint32 bufs;
  deUint32 *depthStencilRbo;
  deUint32 *colorRbo;
  deUint32 *fbo;
  int ndx;
  Vector<float,_4> local_4f4;
  deUint32 local_4e4 [2];
  deUint32 dstDepthStencilRbo;
  deUint32 srcDepthStencilRbo;
  deUint32 dstColorRbo;
  deUint32 srcColorRbo;
  deUint32 dstFbo;
  deUint32 srcFbo;
  deUint32 gradShaderID;
  deUint32 texShaderID;
  deUint32 flatShaderID;
  FlatColorShader flatShader;
  Vector<float,_4> local_354;
  DataTypes local_338;
  undefined1 local_320 [8];
  Texture2DShader texShader;
  GradientShader gradShader;
  deUint32 colorFormat;
  Surface *dst_local;
  BlitDepthStencilCase *this_local;
  
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)&texShader.m_outputType,TYPE_FLOAT_VEC4);
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_338);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_338,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector(&local_354,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&flatShader.super_ShaderProgram.field_0x154,0.0)
  ;
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_320,samplerTypes,TYPE_FLOAT_VEC4,&local_354,
             (Vec4 *)&flatShader.super_ShaderProgram.field_0x154);
  FboTestUtil::DataTypes::~DataTypes(&local_338);
  FboTestUtil::FlatColorShader::FlatColorShader((FlatColorShader *)&texShaderID,TYPE_FLOAT_VEC4);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  gradShaderID = (*pCVar4->_vptr_Context[0x75])(pCVar4,&texShaderID);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  srcFbo = (*pCVar4->_vptr_Context[0x75])(pCVar4,local_320);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dstFbo = (*pCVar4->_vptr_Context[0x75])(pCVar4,&texShader.m_outputType);
  srcColorRbo = 0;
  dstColorRbo = 0;
  srcDepthStencilRbo = 0;
  dstDepthStencilRbo = 0;
  local_4e4[1] = 0;
  local_4e4[0] = 0;
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = dstFbo;
  tcu::Vector<float,_4>::Vector(&local_4f4,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&fbo + 4),1.0);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)&texShader.m_outputType,pCVar4,dVar1,&local_4f4,
             (Vec4 *)((long)&fbo + 4));
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_320,pCVar4,srcFbo);
  for (fbo._0_4_ = 0; (int)fbo < 2; fbo._0_4_ = (int)fbo + 1) {
    if ((int)fbo == 0) {
      local_6f8 = &srcColorRbo;
    }
    else {
      local_6f8 = &dstColorRbo;
    }
    colorRbo = local_6f8;
    if ((int)fbo == 0) {
      local_700 = &srcDepthStencilRbo;
    }
    else {
      local_700 = &dstDepthStencilRbo;
    }
    depthStencilRbo = local_700;
    if ((int)fbo == 0) {
      local_708 = local_4e4 + 1;
    }
    else {
      local_708 = local_4e4;
    }
    pdStack_520 = local_708;
    if ((int)fbo == 0) {
      local_70c = this->m_srcBuffers;
    }
    else {
      local_70c = this->m_dstBuffers;
    }
    size._4_4_ = local_70c;
    if ((int)fbo == 0) {
      local_718 = &this->m_srcSize;
    }
    else {
      local_718 = &this->m_dstSize;
    }
    local_530 = local_718;
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,local_6f8);
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,depthStencilRbo);
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,pdStack_520);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,*depthStencilRbo);
    iVar2 = tcu::Vector<int,_2>::x(local_530);
    iVar3 = tcu::Vector<int,_2>::y(local_530);
    sglr::ContextWrapper::glRenderbufferStorage
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,0x8058,iVar2,iVar3);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,*pdStack_520);
    dVar1 = this->m_format;
    iVar2 = tcu::Vector<int,_2>::x(local_530);
    iVar3 = tcu::Vector<int,_2>::y(local_530);
    sglr::ContextWrapper::glRenderbufferStorage
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,dVar1,iVar2,iVar3);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,*colorRbo);
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,*depthStencilRbo
              );
    if ((size._4_4_ & 0x100) != 0) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,*pdStack_520);
    }
    if ((size._4_4_ & 0x400) != 0) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0x8d41,*pdStack_520);
    }
    FboTestCase::checkError(&this->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
    sglr::ContextWrapper::glClearBufferfi
              (&(this->super_FboTestCase).super_ContextWrapper,0x84f9,0,1.0,0);
  }
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,srcColorRbo);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_srcSize);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_srcSize);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar2,*piVar5);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,7,0xff);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = dstFbo;
  tcu::Vector<float,_3>::Vector(&local_53c,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&dataType,1.0,1.0,1.0);
  sglr::drawQuad(pCVar4,dVar1,&local_53c,(Vec3 *)&dataType);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_srcSize);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_srcSize);
  iVar3 = *piVar5;
  data.m_data.m_cap._4_4_ = 0;
  local_590 = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_588,&local_590,iVar2,iVar3,1);
  tcu::TextureLevel::getAccess(&local_5b8,(TextureLevel *)local_588);
  tcu::Vector<float,_4>::Vector(&local_5c8,0.2,0.7,0.1,1.0);
  tcu::Vector<float,_4>::Vector(&local_5d8,0.7,0.1,0.5,0.8);
  tcu::fillWithGrid(&local_5b8,8,&local_5c8,&local_5d8);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)((long)&data.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,data.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2600);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2800,0x2600);
  tcu::TextureLevel::getAccess(&local_600,(TextureLevel *)local_588);
  data_00 = tcu::PixelBufferAccess::getDataPtr(&local_600);
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0,0x1908,iVar2,iVar3,0,0x1908,
             0x1401,data_00);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,dstColorRbo);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_dstSize);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_dstSize);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar2,*piVar5);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = srcFbo;
  tcu::Vector<float,_3>::Vector(&local_60c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_618,1.0,1.0,0.0);
  sglr::drawQuad(pCVar4,dVar1,&local_60c,&local_618);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_588);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca8,srcColorRbo);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca9,dstColorRbo);
  piVar5 = tcu::Vector<int,_4>::x(&this->m_srcRect);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_4>::y(&this->m_srcRect);
  iVar3 = *piVar5;
  piVar5 = tcu::Vector<int,_4>::z(&this->m_srcRect);
  srcX1 = *piVar5;
  piVar5 = tcu::Vector<int,_4>::w(&this->m_srcRect);
  srcY1 = *piVar5;
  piVar5 = tcu::Vector<int,_4>::x(&this->m_dstRect);
  dstX0 = *piVar5;
  piVar5 = tcu::Vector<int,_4>::y(&this->m_dstRect);
  dstY0 = *piVar5;
  piVar5 = tcu::Vector<int,_4>::z(&this->m_dstRect);
  dstX1 = *piVar5;
  piVar5 = tcu::Vector<int,_4>::w(&this->m_dstRect);
  sglr::ContextWrapper::glBlitFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,iVar2,iVar3,srcX1,srcY1,dstX0,dstY0,
             dstX1,*piVar5,this->m_copyBuffers,0x2600);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,dstColorRbo);
  piVar5 = tcu::Vector<int,_2>::x(&this->m_dstSize);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_dstSize);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar2,*piVar5);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e03,0x1e00);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,0,0xff);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = gradShaderID;
  tcu::Vector<float,_4>::Vector(&local_628,0.0,0.0,1.0,1.0);
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)&texShaderID,pCVar4,dVar1,&local_628);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = gradShaderID;
  tcu::Vector<float,_3>::Vector(&local_634,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_640,1.0,1.0,0.0);
  sglr::drawQuad(pCVar4,dVar1,&local_634,&local_640);
  if ((this->m_dstBuffers & 0x400) != 0) {
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glStencilOp
              (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e00);
    sglr::ContextWrapper::glStencilFunc
              (&(this->super_FboTestCase).super_ContextWrapper,0x202,6,0xff);
    pCVar4 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = gradShaderID;
    tcu::Vector<float,_4>::Vector(&local_650,0.0,1.0,0.0,1.0);
    FboTestUtil::FlatColorShader::setColor((FlatColorShader *)&texShaderID,pCVar4,dVar1,&local_650);
    pCVar4 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = gradShaderID;
    tcu::Vector<float,_3>::Vector(&local_65c,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_668,1.0,1.0,0.0);
    sglr::drawQuad(pCVar4,dVar1,&local_65c,&local_668);
  }
  piVar5 = tcu::Vector<int,_2>::x(&this->m_dstSize);
  iVar2 = *piVar5;
  piVar5 = tcu::Vector<int,_2>::y(&this->m_dstSize);
  iVar3 = *piVar5;
  local_670 = glu::mapGLInternalFormat(0x8058);
  tcu::Vector<float,_4>::Vector(&local_680,1.0);
  tcu::Vector<float,_4>::Vector(&local_690,0.0);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar2,iVar3,&local_670,&local_680,&local_690);
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)&texShaderID);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_320);
  FboTestUtil::GradientShader::~GradientShader((GradientShader *)&texShader.m_outputType);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32			colorFormat			= GL_RGBA8;

		GradientShader			gradShader			(glu::TYPE_FLOAT_VEC4);
		Texture2DShader			texShader			(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		FlatColorShader			flatShader			(glu::TYPE_FLOAT_VEC4);

		deUint32				flatShaderID		= getCurrentContext()->createProgram(&flatShader);
		deUint32				texShaderID			= getCurrentContext()->createProgram(&texShader);
		deUint32				gradShaderID		= getCurrentContext()->createProgram(&gradShader);

		deUint32				srcFbo				= 0;
		deUint32				dstFbo				= 0;
		deUint32				srcColorRbo			= 0;
		deUint32				dstColorRbo			= 0;
		deUint32				srcDepthStencilRbo	= 0;
		deUint32				dstDepthStencilRbo	= 0;

		// setup shaders
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		texShader.setUniforms(*getCurrentContext(), texShaderID);

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&		fbo				= ndx ? dstFbo : srcFbo;
			deUint32&		colorRbo		= ndx ? dstColorRbo : srcColorRbo;
			deUint32&		depthStencilRbo	= ndx ? dstDepthStencilRbo : srcDepthStencilRbo;
			deUint32		bufs			= ndx ? m_dstBuffers : m_srcBuffers;
			const IVec2&	size			= ndx ? m_dstSize : m_srcSize;

			glGenFramebuffers(1, &fbo);
			glGenRenderbuffers(1, &colorRbo);
			glGenRenderbuffers(1, &depthStencilRbo);

			glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
			glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, size.x(), size.y());

			glBindRenderbuffer(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorage(GL_RENDERBUFFER, m_format, size.x(), size.y());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

			if (bufs & GL_DEPTH_BUFFER_BIT)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
			if (bufs & GL_STENCIL_BUFFER_BIT)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);

			// Clear depth to 1 and stencil to 0.
			glClearBufferfi(GL_DEPTH_STENCIL, 0, 1.0f, 0);
		}

		// Fill source with gradient, depth = [-1..1], stencil = 7
		glBindFramebuffer(GL_FRAMEBUFFER, srcFbo);
		glViewport(0, 0, m_srcSize.x(), m_srcSize.y());
		glEnable(GL_DEPTH_TEST);
		glEnable(GL_STENCIL_TEST);
		glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc(GL_ALWAYS, 7, 0xffu);

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Fill destination with grid pattern, depth = 0 and stencil = 1
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= m_srcSize.x();
			const int			texH		= m_srcSize.y();
			deUint32			gridTex		= 0;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &gridTex);
			glBindTexture(GL_TEXTURE_2D, gridTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, dstFbo);
			glViewport(0, 0, m_dstSize.x(), m_dstSize.y());
			glStencilFunc(GL_ALWAYS, 1, 0xffu);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Perform copy.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, srcFbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, dstFbo);
		glBlitFramebuffer(m_srcRect.x(), m_srcRect.y(), m_srcRect.z(), m_srcRect.w(), m_dstRect.x(), m_dstRect.y(), m_dstRect.z(), m_dstRect.w(), m_copyBuffers, GL_NEAREST);

		// Render blue color where depth < 0, decrement on depth failure.
		glBindFramebuffer(GL_FRAMEBUFFER, dstFbo);
		glViewport(0, 0, m_dstSize.x(), m_dstSize.y());
		glStencilOp(GL_KEEP, GL_DECR, GL_KEEP);
		glStencilFunc(GL_ALWAYS, 0, 0xffu);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		if (m_dstBuffers & GL_STENCIL_BUFFER_BIT)
		{
			// Render green color where stencil == 6.
			glDisable(GL_DEPTH_TEST);
			glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
			glStencilFunc(GL_EQUAL, 6, 0xffu);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, m_dstSize.x(), m_dstSize.y(), glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}